

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void __thiscall GB::call_cc_nn(GB *this,u8 mask,u8 val)

{
  u8 uVar1;
  u8 val_local;
  u8 mask_local;
  GB *this_local;
  
  switch((this->s).op_tick) {
  case 0xe:
    uVar1 = read_n(this);
    (this->s).field_6.field_0.z = uVar1;
    break;
  case 0x16:
    uVar1 = read_n(this);
    (this->s).field_6.field_0.w = uVar1;
    f_is(this,mask,val);
    break;
  case 0x26:
    push(this,(u8)((this->s).pc >> 8));
    break;
  case 0x2e:
    push(this,(u8)(this->s).pc);
    (this->s).pc = (u16)(this->s).field_6;
    op_done(this);
  }
  return;
}

Assistant:

void GB::call_cc_nn(u8 mask, u8 val) {
  switch (s.op_tick) {
    case 14: s.z = read_n(); break;
    case 22: s.w = read_n(); f_is(mask, val); break;
    case 38: push(s.pc >> 8); break;
    case 46: push(s.pc); s.pc = s.wz; op_done(); break;
  }
}